

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  size_t sVar1;
  longlong t;
  timespec end;
  timespec start;
  uint i;
  
  clock_gettime(1,(timespec *)&end.tv_nsec);
  str = "";
  for (start.tv_nsec._0_4_ = 0; (uint)start.tv_nsec < 100000;
      start.tv_nsec._0_4_ = (uint)start.tv_nsec + 1) {
    sVar1 = strlen(str);
    if (sVar1 == 0) {
      p = "";
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, empty:\n\t %lld\n","main",((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec
        );
  clock_gettime(1,(timespec *)&end.tv_nsec);
  str = "aldasdklfa;";
  for (start.tv_nsec._0_4_ = 0; (uint)start.tv_nsec < 100000;
      start.tv_nsec._0_4_ = (uint)start.tv_nsec + 1) {
    sVar1 = strlen(str);
    if (sVar1 == 0) {
      p = "";
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, str1:\n\t %lld\n","main",((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec)
  ;
  clock_gettime(1,(timespec *)&end.tv_nsec);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;"
  ;
  for (start.tv_nsec._0_4_ = 0; (uint)start.tv_nsec < 100000;
      start.tv_nsec._0_4_ = (uint)start.tv_nsec + 1) {
    sVar1 = strlen(str);
    if (sVar1 == 0) {
      p = "";
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, str2:\n\t %lld\n","main",((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec)
  ;
  clock_gettime(1,(timespec *)&end.tv_nsec);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj..." /* TRUNCATED STRING LITERAL */
  ;
  for (start.tv_nsec._0_4_ = 0; (uint)start.tv_nsec < 100000;
      start.tv_nsec._0_4_ = (uint)start.tv_nsec + 1) {
    sVar1 = strlen(str);
    if (sVar1 == 0) {
      p = "";
    }
  }
  clock_gettime(1,(timespec *)&t);
  printf("%s, str3:\n\t %lld\n","main",((t - end.tv_nsec) * 1000000000 + end.tv_sec) - start.tv_sec)
  ;
  return 0;
}

Assistant:

int
main()
{
    unsigned int i;
    struct timespec start, end;
    long long t;

    clock_gettime(CLOCK_ID, &start);
    str = "";
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, empty:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR1;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str1:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR2;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str2:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR3;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str3:\n\t %lld\n", __func__, t);
    return 0;
}